

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::EndColumns(void)

{
  uint uVar1;
  ImGuiColumns *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiID id;
  ImGuiWindow *pIVar5;
  ImGuiColumnData *pIVar6;
  float fVar7;
  float _y;
  float fVar8;
  float x_1;
  int n_1;
  float xi;
  ImU32 col;
  bool held;
  bool hovered;
  ImRect column_hit_rect;
  float column_hit_hw;
  ImGuiID column_id;
  float x;
  ImGuiColumnData *column;
  int n;
  int dragging_column;
  float y2;
  float y1;
  bool is_being_resized;
  ImGuiColumnsFlags flags;
  ImGuiColumns *columns;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined1 in_stack_ffffffffffffff63;
  ImGuiID in_stack_ffffffffffffff64;
  ImDrawList *in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff70;
  float idx;
  int in_stack_ffffffffffffff7c;
  ImVec2 in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff8c;
  float in_stack_ffffffffffffff90;
  ImU32 in_stack_ffffffffffffff94;
  ushort in_stack_ffffffffffffff98;
  byte bVar9;
  byte bVar10;
  float in_stack_ffffffffffffff9c;
  float in_stack_ffffffffffffffa4;
  float in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  ImVec2 *in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb8;
  undefined4 uVar11;
  int local_30;
  int local_2c;
  bool local_1d;
  
  pIVar3 = GImGui;
  pIVar5 = GetCurrentWindow();
  pIVar2 = (pIVar5->DC).CurrentColumns;
  PopItemWidth();
  if (1 < pIVar2->Count) {
    PopClipRect();
    ImDrawList::ChannelsMerge((ImDrawList *)0x2227d9);
  }
  uVar1 = pIVar2->Flags;
  fVar7 = ImMax<float>(pIVar2->LineMaxY,(pIVar5->DC).CursorPos.y);
  pIVar2->LineMaxY = fVar7;
  (pIVar5->DC).CursorPos.y = pIVar2->LineMaxY;
  if ((uVar1 & 0x10) == 0) {
    (pIVar5->DC).CursorMaxPos.x = pIVar2->HostCursorMaxPosX;
  }
  local_1d = false;
  if (((uVar1 & 1) == 0) && ((pIVar5->SkipItems & 1U) == 0)) {
    fVar7 = ImMax<float>(pIVar2->HostCursorPosY,(pIVar5->ClipRect).Min.y);
    _y = ImMin<float>((pIVar5->DC).CursorPos.y,(pIVar5->ClipRect).Max.y);
    local_2c = -1;
    for (local_30 = 1; local_30 < pIVar2->Count; local_30 = local_30 + 1) {
      pIVar6 = ImVector<ImGuiColumnData>::operator[](&pIVar2->Columns,local_30);
      idx = (pIVar5->Pos).x;
      fVar8 = GetColumnOffset((int)in_stack_ffffffffffffff70);
      fVar8 = idx + fVar8;
      id = pIVar2->ID + local_30;
      uVar11 = 0x40800000;
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa4,fVar8 - 4.0,fVar7);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff9c,fVar8 + 4.0,_y);
      ImRect::ImRect((ImRect *)&stack0xffffffffffffffac,(ImVec2 *)&stack0xffffffffffffffa4,
                     (ImVec2 *)&stack0xffffffffffffff9c);
      KeepAliveID(id);
      bVar4 = IsClippedEx((ImRect *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                          (bool)in_stack_ffffffffffffff63);
      if (!bVar4) {
        bVar10 = 0;
        bVar9 = 0;
        if ((uVar1 & 2) == 0) {
          ButtonBehavior((ImRect *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         (ImGuiID)in_stack_ffffffffffffffa4,
                         (bool *)CONCAT44(in_stack_ffffffffffffff9c,(uint)in_stack_ffffffffffffff98)
                         ,(bool *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         (ImGuiButtonFlags)in_stack_ffffffffffffff8c);
          if (((bVar10 & 1) != 0) || ((bVar9 & 1) != 0)) {
            pIVar3->MouseCursor = 4;
          }
          if (((bVar9 & 1) != 0) && ((pIVar6->Flags & 2U) == 0)) {
            local_2c = local_30;
          }
        }
        if ((bVar9 & 1) == 0) {
          in_stack_ffffffffffffff70 = 3.78351e-44;
          if ((bVar10 & 1) != 0) {
            in_stack_ffffffffffffff70 = 3.92364e-44;
          }
        }
        else {
          in_stack_ffffffffffffff70 = 4.06377e-44;
        }
        in_stack_ffffffffffffff94 = GetColorU32((ImGuiCol)idx,in_stack_ffffffffffffff70);
        in_stack_ffffffffffffff90 = (float)(int)fVar8;
        in_stack_ffffffffffffff68 = pIVar5->DrawList;
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff88,in_stack_ffffffffffffff90,fVar7 + 1.0);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff80,in_stack_ffffffffffffff90,_y);
        ImDrawList::AddLine((ImDrawList *)CONCAT44(fVar8,id),
                            (ImVec2 *)CONCAT44(uVar11,in_stack_ffffffffffffffb8),
                            in_stack_ffffffffffffffb0,(ImU32)in_stack_ffffffffffffffac,
                            in_stack_ffffffffffffffa8);
      }
    }
    if (local_2c != -1) {
      if ((pIVar2->IsBeingResized & 1U) == 0) {
        for (in_stack_ffffffffffffff7c = 0; in_stack_ffffffffffffff7c < pIVar2->Count + 1;
            in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c + 1) {
          pIVar6 = ImVector<ImGuiColumnData>::operator[](&pIVar2->Columns,in_stack_ffffffffffffff7c)
          ;
          fVar7 = pIVar6->OffsetNorm;
          pIVar6 = ImVector<ImGuiColumnData>::operator[](&pIVar2->Columns,in_stack_ffffffffffffff7c)
          ;
          pIVar6->OffsetNormBeforeResize = fVar7;
        }
      }
      local_1d = true;
      pIVar2->IsBeingResized = true;
      GetDraggedColumnOffset((ImGuiColumns *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      SetColumnOffset(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
    }
  }
  pIVar2->IsBeingResized = local_1d;
  (pIVar5->WorkRect).Min = (pIVar2->HostWorkRect).Min;
  (pIVar5->WorkRect).Max = (pIVar2->HostWorkRect).Max;
  (pIVar5->DC).CurrentColumns = (ImGuiColumns *)0x0;
  (pIVar5->DC).ColumnsOffset.x = 0.0;
  (pIVar5->DC).CursorPos.x =
       (float)(int)((pIVar5->Pos).x + (pIVar5->DC).Indent.x + (pIVar5->DC).ColumnsOffset.x);
  return;
}

Assistant:

void ImGui::EndColumns()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImGuiColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    PopItemWidth();
    if (columns->Count > 1)
    {
        PopClipRect();
        window->DrawList->ChannelsMerge();
    }

    const ImGuiColumnsFlags flags = columns->Flags;
    columns->LineMaxY = ImMax(columns->LineMaxY, window->DC.CursorPos.y);
    window->DC.CursorPos.y = columns->LineMaxY;
    if (!(flags & ImGuiColumnsFlags_GrowParentContentsSize))
        window->DC.CursorMaxPos.x = columns->HostCursorMaxPosX;  // Restore cursor max pos, as columns don't grow parent

    // Draw columns borders and handle resize
    // The IsBeingResized flag ensure we preserve pre-resize columns width so back-and-forth are not lossy
    bool is_being_resized = false;
    if (!(flags & ImGuiColumnsFlags_NoBorder) && !window->SkipItems)
    {
        // We clip Y boundaries CPU side because very long triangles are mishandled by some GPU drivers.
        const float y1 = ImMax(columns->HostCursorPosY, window->ClipRect.Min.y);
        const float y2 = ImMin(window->DC.CursorPos.y, window->ClipRect.Max.y);
        int dragging_column = -1;
        for (int n = 1; n < columns->Count; n++)
        {
            ImGuiColumnData* column = &columns->Columns[n];
            float x = window->Pos.x + GetColumnOffset(n);
            const ImGuiID column_id = columns->ID + ImGuiID(n);
            const float column_hit_hw = COLUMNS_HIT_RECT_HALF_WIDTH;
            const ImRect column_hit_rect(ImVec2(x - column_hit_hw, y1), ImVec2(x + column_hit_hw, y2));
            KeepAliveID(column_id);
            if (IsClippedEx(column_hit_rect, column_id, false))
                continue;

            bool hovered = false, held = false;
            if (!(flags & ImGuiColumnsFlags_NoResize))
            {
                ButtonBehavior(column_hit_rect, column_id, &hovered, &held);
                if (hovered || held)
                    g.MouseCursor = ImGuiMouseCursor_ResizeEW;
                if (held && !(column->Flags & ImGuiColumnsFlags_NoResize))
                    dragging_column = n;
            }

            // Draw column
            const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
            const float xi = IM_FLOOR(x);
            window->DrawList->AddLine(ImVec2(xi, y1 + 1.0f), ImVec2(xi, y2), col);
        }

        // Apply dragging after drawing the column lines, so our rendered lines are in sync with how items were displayed during the frame.
        if (dragging_column != -1)
        {
            if (!columns->IsBeingResized)
                for (int n = 0; n < columns->Count + 1; n++)
                    columns->Columns[n].OffsetNormBeforeResize = columns->Columns[n].OffsetNorm;
            columns->IsBeingResized = is_being_resized = true;
            float x = GetDraggedColumnOffset(columns, dragging_column);
            SetColumnOffset(dragging_column, x);
        }
    }
    columns->IsBeingResized = is_being_resized;

    window->WorkRect = columns->HostWorkRect;
    window->DC.CurrentColumns = NULL;
    window->DC.ColumnsOffset.x = 0.0f;
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
}